

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl.cc
# Opt level: O3

bool bssl::ParseCrlTbsCertList(Input tbs_tlv,ParsedCrlTbsCertList *out)

{
  bool bVar1;
  uint64_t *in_RCX;
  Input in;
  CBS_ASN1_TAG maybe_revoked_certifigates_tag;
  CBS_ASN1_TAG maybe_next_update_tag;
  Parser tbs_parser;
  Input unused_revoked_certificates;
  Input unused_next_update_input;
  optional<bssl::der::Input> version_der;
  Input revoked_certificates_tlv;
  Parser parser;
  CBS_ASN1_TAG local_a8;
  CBS_ASN1_TAG local_a4;
  Parser local_a0;
  _Storage<bssl::der::GeneralizedTime,_true> local_88;
  undefined8 uStack_80;
  Input local_78;
  _Storage<bssl::der::Input,_true> local_60;
  char local_50;
  Input local_48;
  Parser local_30;
  
  der::Parser::Parser(&local_30,tbs_tlv);
  der::Parser::Parser(&local_a0);
  bVar1 = der::Parser::ReadSequence(&local_30,&local_a0);
  if (bVar1) {
    local_50 = '\0';
    bVar1 = der::Parser::ReadOptionalTag
                      (&local_a0,2,(optional<bssl::der::Input> *)&local_60._M_value);
    if (bVar1) {
      if (local_50 == '\x01') {
        in.data_.size_ = (size_t)&local_78;
        in.data_.data_ = (uchar *)local_60._M_value.data_.size_;
        bVar1 = der::ParseUint64((der *)local_60._M_value.data_.data_,in,in_RCX);
        if (!bVar1) {
          return false;
        }
        if (local_78.data_.data_ != &DAT_00000001) {
          return false;
        }
        out->version = V2;
      }
      else {
        out->version = V1;
      }
      bVar1 = der::Parser::ReadRawTLV(&local_a0,&out->signature_algorithm_tlv);
      if (((bVar1) && (bVar1 = der::Parser::ReadRawTLV(&local_a0,&out->issuer_tlv), bVar1)) &&
         (bVar1 = ReadUTCOrGeneralizedTime(&local_a0,&out->this_update), bVar1)) {
        local_78.data_.data_ = (uchar *)0x0;
        local_78.data_.size_ = 0;
        bVar1 = der::Parser::PeekTagAndValue(&local_a0,&local_a4,&local_78);
        if ((bVar1) && (local_a4 - 0x17 < 2)) {
          bVar1 = ReadUTCOrGeneralizedTime(&local_a0,&local_88._M_value);
          if (!bVar1) {
            return false;
          }
          if ((out->next_update).super__Optional_base<bssl::der::GeneralizedTime,_true,_true>.
              _M_payload.super__Optional_payload_base<bssl::der::GeneralizedTime>._M_engaged ==
              false) {
            (out->next_update).super__Optional_base<bssl::der::GeneralizedTime,_true,_true>.
            _M_payload.super__Optional_payload_base<bssl::der::GeneralizedTime>._M_engaged = true;
          }
          (out->next_update).super__Optional_base<bssl::der::GeneralizedTime,_true,_true>._M_payload
          .super__Optional_payload_base<bssl::der::GeneralizedTime>._M_payload = local_88;
        }
        else if ((out->next_update).super__Optional_base<bssl::der::GeneralizedTime,_true,_true>.
                 _M_payload.super__Optional_payload_base<bssl::der::GeneralizedTime>._M_engaged ==
                 true) {
          (out->next_update).super__Optional_base<bssl::der::GeneralizedTime,_true,_true>._M_payload
          .super__Optional_payload_base<bssl::der::GeneralizedTime>._M_engaged = false;
        }
        local_88 = (_Storage<bssl::der::GeneralizedTime,_true>)0x0;
        uStack_80 = 0;
        bVar1 = der::Parser::PeekTagAndValue(&local_a0,&local_a8,(Input *)&local_88._M_value);
        if ((bVar1) && (local_a8 == 0x20000010)) {
          local_48.data_.data_ = (uchar *)0x0;
          local_48.data_.size_ = 0;
          bVar1 = der::Parser::ReadRawTLV(&local_a0,&local_48);
          if (!bVar1) {
            return false;
          }
          (out->revoked_certificates_tlv).super__Optional_base<bssl::der::Input,_true,_true>.
          _M_payload.super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.data_
               = local_48.data_.data_;
          (out->revoked_certificates_tlv).super__Optional_base<bssl::der::Input,_true,_true>.
          _M_payload.super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.size_
               = local_48.data_.size_;
          if ((out->revoked_certificates_tlv).super__Optional_base<bssl::der::Input,_true,_true>.
              _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged == false) {
            (out->revoked_certificates_tlv).super__Optional_base<bssl::der::Input,_true,_true>.
            _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged = true;
          }
        }
        else if ((out->revoked_certificates_tlv).super__Optional_base<bssl::der::Input,_true,_true>.
                 _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
          (out->revoked_certificates_tlv).super__Optional_base<bssl::der::Input,_true,_true>.
          _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
        }
        bVar1 = der::Parser::ReadOptionalTag(&local_a0,0xa0000000,&out->crl_extensions_tlv);
        if ((bVar1) &&
           ((((out->crl_extensions_tlv).super__Optional_base<bssl::der::Input,_true,_true>.
              _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged != true ||
             (out->version == V2)) && (bVar1 = der::Parser::HasMore(&local_a0), !bVar1)))) {
          bVar1 = der::Parser::HasMore(&local_30);
          return !bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ParseCrlTbsCertList(der::Input tbs_tlv, ParsedCrlTbsCertList *out) {
  der::Parser parser(tbs_tlv);

  //   TBSCertList  ::=  SEQUENCE  {
  der::Parser tbs_parser;
  if (!parser.ReadSequence(&tbs_parser)) {
    return false;
  }

  //         version                 Version OPTIONAL,
  //                                      -- if present, MUST be v2
  std::optional<der::Input> version_der;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_INTEGER, &version_der)) {
    return false;
  }
  if (version_der.has_value()) {
    uint64_t version64;
    if (!der::ParseUint64(*version_der, &version64)) {
      return false;
    }
    // If version is present, it MUST be v2(1).
    if (version64 != 1) {
      return false;
    }
    out->version = CrlVersion::V2;
  } else {
    // Uh, RFC 5280 doesn't actually say it anywhere, but presumably if version
    // is not specified, it is V1.
    out->version = CrlVersion::V1;
  }

  //         signature               AlgorithmIdentifier,
  if (!tbs_parser.ReadRawTLV(&out->signature_algorithm_tlv)) {
    return false;
  }

  //         issuer                  Name,
  if (!tbs_parser.ReadRawTLV(&out->issuer_tlv)) {
    return false;
  }

  //         thisUpdate              Time,
  if (!ReadUTCOrGeneralizedTime(&tbs_parser, &out->this_update)) {
    return false;
  }

  //         nextUpdate              Time OPTIONAL,
  CBS_ASN1_TAG maybe_next_update_tag;
  der::Input unused_next_update_input;
  if (tbs_parser.PeekTagAndValue(&maybe_next_update_tag,
                                 &unused_next_update_input) &&
      (maybe_next_update_tag == CBS_ASN1_UTCTIME ||
       maybe_next_update_tag == CBS_ASN1_GENERALIZEDTIME)) {
    der::GeneralizedTime next_update_time;
    if (!ReadUTCOrGeneralizedTime(&tbs_parser, &next_update_time)) {
      return false;
    }
    out->next_update = next_update_time;
  } else {
    out->next_update = std::nullopt;
  }

  //         revokedCertificates     SEQUENCE OF SEQUENCE  { ... } OPTIONAL,
  der::Input unused_revoked_certificates;
  CBS_ASN1_TAG maybe_revoked_certifigates_tag;
  if (tbs_parser.PeekTagAndValue(&maybe_revoked_certifigates_tag,
                                 &unused_revoked_certificates) &&
      maybe_revoked_certifigates_tag == CBS_ASN1_SEQUENCE) {
    der::Input revoked_certificates_tlv;
    if (!tbs_parser.ReadRawTLV(&revoked_certificates_tlv)) {
      return false;
    }
    out->revoked_certificates_tlv = revoked_certificates_tlv;
  } else {
    out->revoked_certificates_tlv = std::nullopt;
  }

  //         crlExtensions           [0]  EXPLICIT Extensions OPTIONAL
  //                                       -- if present, version MUST be v2
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0,
          &out->crl_extensions_tlv)) {
    return false;
  }
  if (out->crl_extensions_tlv.has_value()) {
    if (out->version != CrlVersion::V2) {
      return false;
    }
  }

  if (tbs_parser.HasMore()) {
    // Invalid or extraneous elements.
    return false;
  }

  // By definition the input was a single sequence, so there shouldn't be
  // unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}